

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void __thiscall embree::Device::initTaskingSystem(Device *this,size_t numThreads)

{
  size_t sVar1;
  int iVar2;
  mapped_type *pmVar3;
  size_t numThreads_00;
  pointer __p;
  ulong uVar4;
  ulong uVar5;
  Lock<embree::MutexSys> lock;
  Device *local_28;
  
  MutexSys::lock((MutexSys *)&g_mutex);
  local_28 = this;
  if (numThreads == 0) {
    pmVar3 = std::
             map<embree::Device_*,_unsigned_long,_std::less<embree::Device_*>,_std::allocator<std::pair<embree::Device_*const,_unsigned_long>_>_>
             ::operator[]((map<embree::Device_*,_unsigned_long,_std::less<embree::Device_*>,_std::allocator<std::pair<embree::Device_*const,_unsigned_long>_>_>
                           *)g_num_threads_map,&local_28);
    *pmVar3 = 0xffffffffffffffff;
  }
  else {
    pmVar3 = std::
             map<embree::Device_*,_unsigned_long,_std::less<embree::Device_*>,_std::allocator<std::pair<embree::Device_*const,_unsigned_long>_>_>
             ::operator[]((map<embree::Device_*,_unsigned_long,_std::less<embree::Device_*>,_std::allocator<std::pair<embree::Device_*const,_unsigned_long>_>_>
                           *)g_num_threads_map,&local_28);
    *pmVar3 = numThreads;
  }
  numThreads_00 = getMaxNumThreads();
  TaskScheduler::create
            (numThreads_00,(this->super_State).set_affinity,(this->super_State).start_threads);
  iVar2 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  sVar1 = (this->super_State).numUserThreads;
  __p = (pointer)operator_new(0x30);
  uVar5 = sVar1 + (sVar1 == 0);
  uVar4 = (long)iVar2;
  if (numThreads_00 < (ulong)(long)iVar2) {
    uVar4 = numThreads_00;
  }
  if (uVar4 <= uVar5) {
    uVar5 = uVar4;
  }
  (__p->super_task_arena_base).my_version_and_traits = 1;
  (__p->super_task_arena_base).my_initialization_state._M_i = uninitialized;
  (__p->super_task_arena_base).my_arena._M_b._M_p = (__pointer_type)0x0;
  (__p->super_task_arena_base).my_max_concurrency = (int)uVar4;
  (__p->super_task_arena_base).my_num_reserved_slots = (uint)uVar5;
  (__p->super_task_arena_base).my_priority = normal;
  (__p->super_task_arena_base).my_numa_id = -1;
  (__p->super_task_arena_base).my_core_type = -1;
  (__p->super_task_arena_base).my_max_threads_per_core = -1;
  std::
  __uniq_ptr_impl<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>::
  reset((__uniq_ptr_impl<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>
         *)(this->arena)._M_t.
           super___uniq_ptr_impl<embree::TaskArena,_std::default_delete<embree::TaskArena>_>._M_t.
           super__Tuple_impl<0UL,_embree::TaskArena_*,_std::default_delete<embree::TaskArena>_>.
           super__Head_base<0UL,_embree::TaskArena_*,_false>._M_head_impl,__p);
  MutexSys::unlock((MutexSys *)&g_mutex);
  return;
}

Assistant:

void Device::initTaskingSystem(size_t numThreads) 
  {
    Lock<MutexSys> lock(g_mutex);
    if (numThreads == 0) 
      g_num_threads_map[this] = std::numeric_limits<size_t>::max();
    else 
      g_num_threads_map[this] = numThreads;

    /* create task scheduler */
    size_t maxNumThreads = getMaxNumThreads();
    TaskScheduler::create(maxNumThreads,State::set_affinity,State::start_threads);
#if USE_TASK_ARENA
    const size_t nThreads = min(maxNumThreads,TaskScheduler::threadCount());
    const size_t uThreads = min(max(numUserThreads,(size_t)1),nThreads);
    arena->arena = make_unique(new tbb::task_arena((int)nThreads,(unsigned int)uThreads));
#endif
  }